

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
             *this,wchar_t **it)

{
  undefined4 uVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  lVar4 = *(long *)(this + 0x10);
  if (lVar4 != 0) {
    pwVar3 = *it;
    if (0 < lVar4) {
      pcVar5 = *(char **)(this + 8);
      lVar4 = lVar4 + 1;
      do {
        *pwVar3 = (int)*pcVar5;
        pcVar5 = pcVar5 + 1;
        pwVar3 = pwVar3 + 1;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    *it = pwVar3;
  }
  pwVar2 = *it;
  lVar4 = *(long *)(this + 0x20);
  pwVar3 = pwVar2;
  if (lVar4 != 0) {
    pwVar3 = pwVar2 + lVar4;
    uVar1 = *(undefined4 *)(this + 0x18);
    lVar6 = 0;
    do {
      *(undefined4 *)((long)pwVar2 + lVar6) = uVar1;
      lVar6 = lVar6 + 4;
    } while (lVar4 << 2 != lVar6);
  }
  *it = pwVar3;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }